

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
* __thiscall
chaiscript::detail::Dispatch_Engine::get_types_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>_>
           *__return_storage_ptr__,Dispatch_Engine *this)

{
  shared_lock<chaiscript::detail::threading::shared_mutex> l;
  allocator_type local_21;
  shared_lock<std::shared_mutex> local_20;
  
  local_20._M_owns = true;
  local_20._M_pm = &this->m_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  std::
  vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
  ::
  vector<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,chaiscript::Type_Info>>,void>
            ((vector<std::pair<std::__cxx11::string,chaiscript::Type_Info>,std::allocator<std::pair<std::__cxx11::string,chaiscript::Type_Info>>>
              *)__return_storage_ptr__,
             (this->m_state).m_types._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Type_Info>_>
              )&(this->m_state).m_types._M_t._M_impl.super__Rb_tree_header,&local_21);
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<std::string, Type_Info>> get_types() const {
        chaiscript::detail::threading::shared_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        return std::vector<std::pair<std::string, Type_Info>>(m_state.m_types.begin(), m_state.m_types.end());
      }